

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Generators::Generators<arg_res_tuple<float,_2UL>_>::populate
          (Generators<arg_res_tuple<float,_2UL>_> *this,arg_res_tuple<float,_2UL> *val)

{
  arg_res_tuple<float,_2UL> *in_stack_00000008;
  GeneratorWrapper<arg_res_tuple<float,_2UL>_> *in_stack_ffffffffffffffd8;
  vector<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,_2UL>_>,_std::allocator<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,_2UL>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  value<arg_res_tuple<float,2ul>>(in_stack_00000008);
  std::
  vector<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,2ul>>,std::allocator<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,2ul>>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,2ul>>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  GeneratorWrapper<arg_res_tuple<float,_2UL>_>::~GeneratorWrapper
            ((GeneratorWrapper<arg_res_tuple<float,_2UL>_> *)0x3b55d9);
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }